

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::list_caster<std::vector<float,_std::allocator<float>_>,_float>::load
          (list_caster<std::vector<float,_std::allocator<float>_>,_float> *this,handle src,
          bool convert)

{
  pointer pfVar1;
  bool bVar2;
  bool bVar3;
  handle src_00;
  sequence s;
  value_conv conv;
  iterator __end3;
  iterator __begin3;
  handle local_80;
  handle local_78;
  type_caster<float,_void> local_6c;
  iterator local_68;
  iterator local_48;
  
  bVar2 = sequence::check_(src);
  if (bVar2) {
    if (src.m_ptr != (PyObject *)0x0) {
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    }
    pfVar1 = (this->value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (this->value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    if (src.m_ptr != (PyObject *)0x0) {
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    }
    local_80.m_ptr = src.m_ptr;
    local_78.m_ptr = src.m_ptr;
    reserve_maybe<std::vector<float,_std::allocator<float>_>,_0>
              (this,(sequence *)&local_80,&this->value);
    object::~object((object *)&local_80);
    local_48.super_object.super_handle.m_ptr = (handle)PyObject_GetIter(local_78.m_ptr);
    local_48.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_48.ready = false;
    local_68.ready = false;
    local_68.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_68.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
    while( true ) {
      bVar2 = iterator::operator!=(&local_48,&local_68);
      if (!bVar2) break;
      src_00 = iterator::operator*(&local_48);
      bVar3 = type_caster<float,_void>::load(&local_6c,src_00,convert);
      if (!bVar3) break;
      std::vector<float,_std::allocator<float>_>::push_back(&this->value,&local_6c.value);
      iterator::operator++(&local_48);
    }
    iterator::~iterator(&local_68);
    iterator::~iterator(&local_48);
    bVar2 = !bVar2;
    object::~object((object *)&local_78);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value_conv conv;
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value>(conv));
        }
        return true;
    }